

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

string * __thiscall
deqp::gls::probabilityStr_abi_cxx11_(string *__return_storage_ptr__,gls *this,float prob)

{
  bool bVar1;
  int in_EDX;
  string local_48;
  byte local_26;
  allocator<char> local_25 [15];
  byte local_16;
  allocator<char> local_15;
  float local_14;
  string *psStack_10;
  float prob_local;
  
  local_16 = 0;
  local_26 = 0;
  bVar1 = false;
  local_14 = prob;
  psStack_10 = __return_storage_ptr__;
  if ((prob != 0.0) || (NAN(prob))) {
    if ((prob != 1.0) || (NAN(prob))) {
      de::floatToString_abi_cxx11_(&local_48,(de *)0x0,prob * 100.0,in_EDX);
      bVar1 = true;
      std::operator+(__return_storage_ptr__,&local_48,"%");
    }
    else {
      std::allocator<char>::allocator();
      local_26 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"ALWAYS",local_25);
    }
  }
  else {
    std::allocator<char>::allocator();
    local_16 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"never",&local_15);
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_26 & 1) != 0) {
    std::allocator<char>::~allocator(local_25);
  }
  if ((local_16 & 1) != 0) {
    std::allocator<char>::~allocator(&local_15);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string probabilityStr (const float prob)
{
	return prob == 0.0f ? "never"	:
		   prob == 1.0f ? "ALWAYS"	:
		   de::floatToString(prob*100.0f, 0) + "%";
}